

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-lstm.cc
# Opt level: O1

void __thiscall
dynet::VanillaLSTMC::backward_dev_impl<dynet::Device_CPU>
          (VanillaLSTMC *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  type local_138;
  ulong local_100;
  ulong local_f8;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_f0;
  Device_CPU *local_e8;
  ulong local_e0;
  TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
  local_d8;
  type local_c8;
  
  local_d8.m_lhs_xpr = &local_138;
  uVar5 = 1;
  if ((fx->d).nd != 0) {
    uVar5 = (ulong)(fx->d).d[0];
  }
  uVar6 = (ulong)(fx->d).bd;
  if (i == 1) {
    uVar2 = (ulong)(dEdf->d).nd;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdf->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3;
    }
    local_f8 = (ulong)(uint)((int)uVar5 * 3);
    local_e0 = (ulong)(dEdf->d).bd;
    pTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
             ._M_impl.super__Vector_impl_data._M_start[1];
    uVar2 = (ulong)(pTVar1->d).nd;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (pTVar1->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3
      ;
    }
    local_c8.m_rhs_xpr.m_lhs_xpr.m_data = dEdf->v;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_data = pTVar1->v;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         (long)(pTVar1->d).bd;
    local_138.m_xpr.m_data = dEdxi->v;
    uVar2 = (ulong)(dEdxi->d).nd;
    local_100 = 1;
    local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdxi->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3;
    }
    local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
    local_138.m_indices.super_array<long,_2>._M_elems[0] = 0;
    local_138.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = 0;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_138.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_138.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    local_f0 = xs;
    local_e8 = dev;
    local_d8.m_rhs_xpr = &local_c8;
    local_c8.m_lhs_xpr.m_xpr.m_data = local_138.m_xpr.m_data;
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = local_e0;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = local_f8;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run(&local_d8,dev->edevice);
    uVar2 = (ulong)(dEdf->d).nd;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdf->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_100 = (ulong)uVar3;
    }
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdf->d).bd;
    pTVar1 = *(local_f0->
              super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (ulong)(pTVar1->d).nd;
    local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (pTVar1->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3
      ;
    }
    local_c8.m_rhs_xpr.m_lhs_xpr.m_data = dEdf->v;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_data = pTVar1->v;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         (long)(pTVar1->d).bd;
    local_138.m_xpr.m_data = dEdxi->v;
    uVar2 = (ulong)(dEdxi->d).nd;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdxi->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3;
    }
    local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
    local_138.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = local_100;
    local_138.m_indices.super_array<long,_2>._M_elems[0] = uVar5;
    local_138.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_138.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    local_d8.m_lhs_xpr = &local_138;
    local_d8.m_rhs_xpr = &local_c8;
    local_c8.m_lhs_xpr.m_xpr.m_data = local_138.m_xpr.m_data;
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run((TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
           *)&local_d8,local_e8->edevice);
    uVar2 = (ulong)(dEdf->d).nd;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdf->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3;
    }
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdf->d).bd;
    pTVar1 = (local_f0->
             super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[1];
    uVar2 = (ulong)(pTVar1->d).nd;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (pTVar1->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3
      ;
    }
    local_c8.m_rhs_xpr.m_lhs_xpr.m_data = dEdf->v;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_data = pTVar1->v;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         (long)(pTVar1->d).bd;
    local_138.m_xpr.m_data = dEdxi->v;
    uVar2 = (ulong)(dEdxi->d).nd;
    if (uVar2 == 0) {
      local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    }
    else {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdxi->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3;
    }
    local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
    local_138.m_indices.super_array<long,_2>._M_elems[0] = local_f8;
    local_138.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = local_f8;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = 0;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_138.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_138.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    local_d8.m_lhs_xpr = &local_138;
    local_d8.m_rhs_xpr = &local_c8;
    local_c8.m_lhs_xpr.m_xpr.m_data = local_138.m_xpr.m_data;
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar6;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run(&local_d8,local_e8->edevice);
  }
  else if (i == 0) {
    uVar2 = (ulong)(dEdf->d).nd;
    local_c8.m_rhs_xpr.m_lhs_xpr.m_data = (StoragePointerType)0x1;
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 1;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdf->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = (long)uVar3;
    }
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = (long)(dEdf->d).bd;
    pTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
             ._M_impl.super__Vector_impl_data._M_start[1];
    uVar2 = (ulong)(pTVar1->d).nd;
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (pTVar1->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_c8.m_rhs_xpr.m_lhs_xpr.m_data = (StoragePointerType)(ulong)uVar3;
    }
    local_c8.m_lhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = (long)dEdf->v;
    local_c8.m_lhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = (long)pTVar1->v;
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         (long)(pTVar1->d).bd;
    local_138.m_xpr.m_data = dEdxi->v;
    uVar2 = (ulong)(dEdxi->d).nd;
    if (uVar2 == 0) {
      local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    }
    else {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar3 = uVar3 * (dEdxi->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar3;
    }
    local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
    local_d8.m_rhs_xpr = &local_c8;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_data = (StoragePointerType)0x0;
    local_d8.m_lhs_xpr = &local_138;
    local_c8.m_lhs_xpr.m_xpr.m_data = local_138.m_xpr.m_data;
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_c8.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_138.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = uVar5;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = uVar5;
    local_c8.m_rhs_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = uVar6;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
           *)&local_d8,dev->edevice);
  }
  return;
}

Assistant:

void VanillaLSTMC::backward_dev_impl(const MyDevice & dev,
                               const vector<const Tensor*>& xs,
                               const Tensor& fx,
                               const Tensor& dEdf,
                               unsigned i,
                               Tensor& dEdxi) const {
    unsigned hidden_dim = fx.d[0];

    Eigen::DSizes<ptrdiff_t, 2> indices_i(0,0);
    Eigen::DSizes<ptrdiff_t, 2> indices_f(hidden_dim,0);
    Eigen::DSizes<ptrdiff_t, 2> indices_g(hidden_dim*3,0);
    Eigen::DSizes<ptrdiff_t, 2> sizes_1(hidden_dim, static_cast<ptrdiff_t>(fx.d.bd));

    if(i==0){ // dc_tm1 = dc_t . f_t
      dEdxi.tbvec().device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_f, sizes_1);
    } else if(i==1){
      // di_t = dc_t . g_t
      dEdxi.tbvec().slice(indices_i, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_g, sizes_1);
      // df_t = dc_t . c_tm1
      dEdxi.tbvec().slice(indices_f, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[0]->tbvec();
      // dg_t = dc_t . i_t
      dEdxi.tbvec().slice(indices_g, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_i, sizes_1);
    }
  }